

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

char * read_file_from_fd(int fd,size_t *len)

{
  size_t __nbytes;
  size_t sVar1;
  __off_t _Var2;
  char *pcVar3;
  ssize_t sVar4;
  
  sVar1 = lseek(fd,0,2);
  *len = sVar1;
  if ((sVar1 == 0xffffffffffffffff) || (_Var2 = lseek(fd,0,0), _Var2 == -1)) {
    pcVar3 = "lseek";
  }
  else {
    __nbytes = *len;
    pcVar3 = (char *)calloc(1,__nbytes + 1);
    if (pcVar3 != (char *)0x0) {
      sVar4 = read(fd,pcVar3,__nbytes);
      if (sVar4 == -1) {
        perror("read");
        free(pcVar3);
        return (char *)0x0;
      }
      pcVar3[*len] = '\0';
      return pcVar3;
    }
    pcVar3 = "malloc";
  }
  perror(pcVar3);
  return (char *)0x0;
}

Assistant:

char *
read_file_from_fd (int fd, size_t *len)
{
  size_t bytes_read;
  char *text = NULL;
  *len = lseek (fd, 0, SEEK_END);

  if (unlikely (*len == -1))
    {
      perror ("lseek");
      return NULL;
    }

  if (unlikely (lseek (fd, 0, SEEK_SET) == -1))
    {
      perror ("lseek");
      return NULL;
    }

  text = malloc (*len + 1);
  if (unlikely (text == NULL))
    {
      perror ("malloc");
      return NULL;
    }
  memset (text, 0, *len + 1);

  if (read (fd, text, *len) == -1)
    {
      perror ("read");
      free (text);
      return NULL;
    }

  text[*len] = '\0';

  return text;
}